

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O1

void __thiscall
btGeneric6DofConstraint::btGeneric6DofConstraint
          (btGeneric6DofConstraint *this,btRigidBody *rbA,btRigidBody *rbB,btTransform *frameInA,
          btTransform *frameInB,bool useLinearReferenceFrameA)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  long lVar3;
  
  btTypedConstraint::btTypedConstraint(&this->super_btTypedConstraint,D6_CONSTRAINT_TYPE,rbA,rbB);
  (this->super_btTypedConstraint)._vptr_btTypedConstraint =
       (_func_int **)&PTR__btTypedConstraint_00228088;
  uVar2 = *(undefined8 *)((frameInA->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[0].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInA->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[1].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInA->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInA->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInA).m_basis.m_el[2].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInA->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInA).m_origin.m_floats = *(undefined8 *)(frameInA->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInA).m_origin.m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_basis).m_el[0].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[0].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[0].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[0].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_basis).m_el[1].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[1].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[1].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[1].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_basis).m_el[2].m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_basis.m_el[2].m_floats =
       *(undefined8 *)(frameInB->m_basis).m_el[2].m_floats;
  *(undefined8 *)((this->m_frameInB).m_basis.m_el[2].m_floats + 2) = uVar2;
  uVar2 = *(undefined8 *)((frameInB->m_origin).m_floats + 2);
  *(undefined8 *)(this->m_frameInB).m_origin.m_floats = *(undefined8 *)(frameInB->m_origin).m_floats
  ;
  *(undefined8 *)((this->m_frameInB).m_origin.m_floats + 2) = uVar2;
  (this->m_linearLimits).m_lowerLimit.m_floats[0] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[1] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[2] = 0.0;
  (this->m_linearLimits).m_lowerLimit.m_floats[3] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[0] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[1] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[2] = 0.0;
  (this->m_linearLimits).m_upperLimit.m_floats[3] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[0] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[1] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[2] = 0.0;
  (this->m_linearLimits).m_accumulatedImpulse.m_floats[3] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[0] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[1] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[2] = 0.0;
  (this->m_linearLimits).m_normalCFM.m_floats[3] = 0.0;
  (this->m_linearLimits).m_stopERP.m_floats[0] = 0.2;
  (this->m_linearLimits).m_stopERP.m_floats[1] = 0.2;
  (this->m_linearLimits).m_stopERP.m_floats[2] = 0.2;
  (this->m_linearLimits).m_stopCFM.m_floats[3] = 0.0;
  *(undefined8 *)((this->m_linearLimits).m_stopERP.m_floats + 3) = 0;
  (this->m_linearLimits).m_stopCFM.m_floats[1] = 0.0;
  (this->m_linearLimits).m_stopCFM.m_floats[2] = 0.0;
  (this->m_linearLimits).m_limitSoftness = 0.7;
  (this->m_linearLimits).m_damping = 1.0;
  (this->m_linearLimits).m_restitution = 0.5;
  (this->m_linearLimits).m_enableMotor[2] = false;
  (this->m_linearLimits).m_enableMotor[0] = false;
  (this->m_linearLimits).m_enableMotor[1] = false;
  (this->m_linearLimits).m_targetVelocity.m_floats[0] = 0.0;
  (this->m_linearLimits).m_targetVelocity.m_floats[1] = 0.0;
  (this->m_linearLimits).m_targetVelocity.m_floats[2] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[0] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[1] = 0.0;
  (this->m_linearLimits).m_maxMotorForce.m_floats[2] = 0.0;
  lVar3 = 0x3b8;
  do {
    puVar1 = (undefined8 *)((long)this + lVar3 + -0x3c);
    *puVar1 = 0xbf8000003f800000;
    puVar1[1] = 0x3dcccccd00000000;
    *(undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -100) = 0x3e4ccccd;
    *(undefined4 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x5c) = 0;
    puVar1 = (undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x74);
    *puVar1 = 0x3f80000043960000;
    puVar1[1] = 0x3f000000;
    *(undefined8 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x4c) = 0;
    *(undefined4 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x54) = 0;
    *(undefined1 *)((long)(this->m_frameInA).m_basis.m_el[0].m_floats + lVar3 + -0x58) = 0;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x478);
  this->m_useLinearReferenceFrameA = useLinearReferenceFrameA;
  this->m_useOffsetForConstraintFrame = true;
  this->m_flags = 0;
  this->m_useSolveConstraintObsolete = false;
  calculateTransforms(this,&(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                            m_worldTransform,
                      &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                       m_worldTransform);
  return;
}

Assistant:

btGeneric6DofConstraint::btGeneric6DofConstraint(btRigidBody& rbA, btRigidBody& rbB, const btTransform& frameInA, const btTransform& frameInB, bool useLinearReferenceFrameA)
: btTypedConstraint(D6_CONSTRAINT_TYPE, rbA, rbB)
, m_frameInA(frameInA)
, m_frameInB(frameInB),
m_useLinearReferenceFrameA(useLinearReferenceFrameA),
m_useOffsetForConstraintFrame(D6_USE_FRAME_OFFSET),
m_flags(0),
m_useSolveConstraintObsolete(D6_USE_OBSOLETE_METHOD)
{
	calculateTransforms();
}